

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall kratos::IRVisitor::visit_root(IRVisitor *this,IRNode *root)

{
  pointer *this_00;
  key_type pIVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar4;
  pair<std::__detail::_Node_iterator<kratos::IRNode_*,_true,_false>,_bool> pVar5;
  key_type local_40;
  IRNode *child;
  
  (**root->_vptr_IRNode)(root,this);
  this->level = this->level + 1;
  child = (IRNode *)this;
  iVar2 = (*root->_vptr_IRNode[1])(root);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    this_00 = &(child->fn_name_ln).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = 0;
    do {
      iVar2 = (*root->_vptr_IRNode[2])(root,uVar4);
      local_40 = (key_type)CONCAT44(extraout_var_00,iVar2);
      iVar3 = std::
              _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)this_00,&local_40);
      if (iVar3.super__Node_iterator_base<kratos::IRNode_*,_false>._M_cur == (__node_type *)0x0) {
        pVar5 = std::
                _Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::_M_emplace<kratos::IRNode*&>
                          ((_Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)this_00,&local_40);
        (**child->_vptr_IRNode)(child,local_40,pVar5._8_8_);
      }
      iVar2 = (*root->_vptr_IRNode[1])(root);
      pIVar1 = local_40;
      if (uVar4 < CONCAT44(extraout_var_01,iVar2)) {
        iVar2 = (*root->_vptr_IRNode[2])(root,uVar4);
        uVar4 = uVar4 + (pIVar1 == (key_type)CONCAT44(extraout_var_02,iVar2));
      }
      iVar2 = (*root->_vptr_IRNode[1])(root);
    } while (uVar4 < CONCAT44(extraout_var_03,iVar2));
  }
  *(int *)&(child->fn_name_ln).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start =
       *(int *)&(child->fn_name_ln).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start + -1;
  return;
}

Assistant:

void IRVisitor::visit_root(IRNode *root) {
    // recursively call visits
    root->accept(this);
    level++;
    uint64_t count = 0;
    while (count < root->child_count()) {
        auto *child = root->get_child(count);
        if (visited_.find(child) == visited_.end()) {
            visited_.emplace(child);
            visit_root(child);
        }
        if (count < root->child_count() && child == root->get_child(count)) {
            count++;
        }
    }
    level--;
}